

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  float *scanline;
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  stbtt__active_edge *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  stbtt__active_edge *z;
  ulong uVar9;
  stbtt__point *__ptr;
  stbtt__point *points;
  stbtt__edge *p;
  float *scanline_00;
  undefined8 *puVar10;
  stbtt__active_edge *psVar11;
  uchar uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  stbtt__edge *psVar16;
  stbtt__active_edge *psVar17;
  long lVar18;
  ulong uVar19;
  undefined8 *__ptr_00;
  int iVar20;
  int iVar21;
  stbtt__edge *psVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float local_2c8;
  stbtt__active_edge *local_2b0;
  stbtt__active_edge *active;
  long local_2a0;
  float y0;
  stbtt__point *local_280;
  stbtt__bitmap *local_278;
  ulong local_270;
  float local_264;
  int local_260;
  float local_25c;
  undefined1 local_258 [16];
  undefined8 *local_240;
  ulong local_238;
  int local_230;
  
  fVar29 = scale_y;
  if (scale_x <= scale_y) {
    fVar29 = scale_x;
  }
  uVar9 = 0;
  uVar15 = (ulong)(uint)num_verts;
  if (num_verts < 1) {
    uVar15 = uVar9;
  }
  uVar14 = 0;
  for (; uVar15 * 0xe - uVar9 != 0; uVar9 = uVar9 + 0xe) {
    uVar14 = (ulong)((int)uVar14 + (uint)((&vertices->type)[uVar9] == '\x01'));
  }
  if (((int)uVar14 == 0) ||
     (y0 = shift_y, local_278 = result, __ptr = (stbtt__point *)malloc(uVar14 * 4),
     __ptr == (stbtt__point *)0x0)) {
    return;
  }
  local_258._0_4_ = x_off;
  fVar26 = (flatness_in_pixels / fVar29) * (flatness_in_pixels / fVar29);
  points = (stbtt__point *)0x0;
  fVar27 = 0.0;
  iVar20 = 0;
  fVar29 = 0.0;
  local_270 = (ulong)(uint)y_off;
  do {
    scanline_00 = (float *)&local_238;
    if (iVar20 == 1) {
      points = (stbtt__point *)malloc((long)(int)fVar29 << 3);
      if (points == (stbtt__point *)0x0) goto LAB_0013b3a1;
    }
    else if (iVar20 == 2) {
      if (points == (stbtt__point *)0x0) {
        return;
      }
      iVar20 = 0;
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        iVar20 = iVar20 + (int)(&__ptr->x)[uVar15];
      }
      local_2c8 = scale_y;
      if (invert != 0) {
        local_2c8 = -scale_y;
      }
      local_280 = points;
      p = (stbtt__edge *)malloc((long)(iVar20 + 1) * 0x14);
      if (p != (stbtt__edge *)0x0) {
        iVar20 = 0;
        iVar21 = 0;
        for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
          fVar29 = (&__ptr->x)[uVar15];
          uVar19 = (ulong)((int)fVar29 - 1);
          uVar9 = 0;
          if (0 < (int)fVar29) {
            uVar9 = (ulong)(uint)fVar29;
          }
          for (uVar23 = 0; iVar24 = (int)uVar19, uVar9 != uVar23; uVar23 = uVar23 + 1) {
            uVar19 = (ulong)iVar24;
            fVar27 = local_280[(long)iVar20 + uVar19].y;
            fVar26 = local_280[(long)iVar20 + uVar23].y;
            if ((fVar27 != fVar26) || (NAN(fVar27) || NAN(fVar26))) {
              psVar16 = p + iVar21;
              p[iVar21].invert = 0;
              if (invert == 0) {
                if (fVar26 <= fVar27) goto LAB_0013a957;
LAB_0013a945:
                psVar16->invert = 1;
                uVar19 = uVar23;
              }
              else {
                if (fVar26 < fVar27) goto LAB_0013a945;
LAB_0013a957:
                iVar24 = (int)uVar23;
              }
              sVar2 = local_280[(long)iVar20 + (long)iVar24];
              sVar3 = local_280[(long)iVar20 + uVar19];
              psVar16->x0 = sVar2.x * scale_x + shift_x;
              psVar16->y0 = sVar2.y * local_2c8 + y0;
              psVar16->x1 = sVar3.x * scale_x + shift_x;
              psVar16->y1 = sVar3.y * local_2c8 + y0;
              iVar21 = iVar21 + 1;
            }
            uVar19 = uVar23 & 0xffffffff;
          }
          iVar20 = (int)fVar29 + iVar20;
        }
        stbtt__sort_edges_quicksort(p,iVar21);
        psVar16 = p;
        for (uVar15 = 1; (long)uVar15 < (long)iVar21; uVar15 = uVar15 + 1) {
          uVar1 = p[uVar15].x0;
          uVar4 = p[uVar15].y0;
          local_230 = p[uVar15].invert;
          local_238._0_4_ = p[uVar15].x1;
          local_238._4_4_ = p[uVar15].y1;
          psVar22 = psVar16;
          for (uVar9 = uVar15; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
            if (psVar22->y0 <= (float)uVar4) goto LAB_0013aa12;
            psVar22[1].invert = psVar22->invert;
            fVar29 = psVar22->y0;
            fVar27 = psVar22->x1;
            fVar26 = psVar22->y1;
            psVar22[1].x0 = psVar22->x0;
            psVar22[1].y0 = fVar29;
            psVar22[1].x1 = fVar27;
            psVar22[1].y1 = fVar26;
            psVar22 = psVar22 + -1;
          }
          uVar9 = 0;
LAB_0013aa12:
          iVar20 = (int)uVar9;
          if (uVar15 != (uVar9 & 0xffffffff)) {
            p[iVar20].x0 = (float)uVar1;
            p[iVar20].y0 = (float)uVar4;
            p[iVar20].x1 = (float)local_238;
            p[iVar20].y1 = (float)local_238._4_4_;
            p[iVar20].invert = local_230;
          }
          psVar16 = psVar16 + 1;
        }
        active = (stbtt__active_edge *)0x0;
        lVar25 = (long)local_278->w;
        if (0x40 < lVar25) {
          scanline_00 = (float *)malloc((ulong)(uint)local_278->w * 8 + 4);
        }
        iVar20 = local_278->h;
        scanline = scanline_00 + lVar25;
        p[iVar21].y0 = (float)(iVar20 + (int)local_270) + 1.0;
        local_264 = (float)(int)local_258._0_4_;
        local_2b0 = (stbtt__active_edge *)0x0;
        iVar24 = 0;
        __ptr_00 = (undefined8 *)0x0;
        uVar15 = local_270;
        psVar16 = p;
        local_2a0 = lVar25;
        for (iVar21 = 0; iVar21 < iVar20; iVar21 = iVar21 + 1) {
          y0 = (float)(int)uVar15;
          fVar27 = y0 + 1.0;
          lVar25 = (long)(int)(float)local_2a0;
          local_270 = uVar15;
          memset(scanline_00,0,lVar25 * 4);
          memset(scanline,0,lVar25 * 4 + 4);
          fVar29 = y0;
          psVar11 = (stbtt__active_edge *)&active;
          while (psVar17 = psVar11, psVar5 = psVar17->next, psVar5 != (stbtt__active_edge *)0x0) {
            psVar11 = psVar5;
            if (psVar5->ey <= fVar29) {
              psVar17->next = psVar5->next;
              if ((psVar5->direction == 0.0) && (!NAN(psVar5->direction))) {
                __assert_fail("z->direction",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xc4e,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              psVar5->direction = 0.0;
              psVar5->next = local_2b0;
              psVar11 = psVar17;
              local_2b0 = psVar5;
            }
          }
          for (; fVar26 = psVar16->y0, fVar26 <= fVar27; psVar16 = psVar16 + 1) {
            fVar36 = psVar16->y1;
            puVar10 = __ptr_00;
            if ((fVar26 != fVar36) || (NAN(fVar26) || NAN(fVar36))) {
              if (local_2b0 == (stbtt__active_edge *)0x0) {
                if (iVar24 == 0) {
                  puVar10 = (undefined8 *)malloc(0x6408);
                  if (puVar10 == (undefined8 *)0x0) {
                    __assert_fail("z != __null",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                  ,0xabe,
                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                 );
                  }
                  *puVar10 = __ptr_00;
                  iVar24 = 799;
                  fVar29 = y0;
                }
                else {
                  iVar24 = iVar24 + -1;
                }
                local_2b0 = (stbtt__active_edge *)(puVar10 + (long)iVar24 * 4 + 1);
                psVar11 = (stbtt__active_edge *)0x0;
              }
              else {
                psVar11 = local_2b0->next;
              }
              fVar28 = psVar16->x0;
              fVar33 = (psVar16->x1 - fVar28) / (fVar36 - fVar26);
              local_2b0->fdx = fVar33;
              local_2b0->fdy = (float)(-(uint)(fVar33 != 0.0) & (uint)(1.0 / fVar33));
              local_2b0->fx = ((fVar29 - fVar26) * fVar33 + fVar28) - local_264;
              local_2b0->direction = *(float *)(&DAT_0016ee50 + (ulong)(psVar16->invert == 0) * 4);
              local_2b0->sy = fVar26;
              local_2b0->ey = fVar36;
              local_2b0->next = (stbtt__active_edge *)0x0;
              if (fVar36 < fVar29) {
                __assert_fail("z->ey >= scan_y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xc5b,
                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                             );
              }
              local_2b0->next = active;
              active = local_2b0;
              local_2b0 = psVar11;
            }
            __ptr_00 = puVar10;
          }
          local_240 = __ptr_00;
          if (active != (stbtt__active_edge *)0x0) {
            iVar6 = (int)local_2a0;
            fVar26 = (float)iVar6;
            iVar20 = 0;
            if (0 < iVar6) {
              iVar20 = iVar6;
            }
            local_260 = iVar21;
            for (psVar11 = active; iVar21 = local_260, psVar11 != (stbtt__active_edge *)0x0;
                psVar11 = psVar11->next) {
              fVar36 = psVar11->ey;
              if (fVar36 < fVar29) {
                __assert_fail("e->ey >= y_top",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                              ,0xb92,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar28 = psVar11->fx;
              fVar33 = psVar11->fdx;
              if ((fVar33 != 0.0) || (NAN(fVar33))) {
                fVar31 = psVar11->sy;
                if (fVar27 < fVar31) {
                  __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                ,0xba5,
                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                               );
                }
                fVar38 = fVar33 + fVar28;
                fVar32 = (float)(~-(uint)(fVar29 < fVar31) & (uint)fVar28 |
                                (uint)((fVar31 - fVar29) * fVar33 + fVar28) &
                                -(uint)(fVar29 < fVar31));
                if ((((fVar32 < 0.0) ||
                     (fVar37 = (float)(~-(uint)(fVar36 < fVar27) & (uint)fVar38 |
                                      (uint)((fVar36 - fVar29) * fVar33 + fVar28) &
                                      -(uint)(fVar36 < fVar27)), fVar37 < 0.0)) ||
                    (fVar26 <= fVar32)) || (fVar26 <= fVar37)) {
                  local_258 = ZEXT416((uint)fVar28);
                  local_25c = fVar33;
                  iVar21 = 0;
                  while (iVar20 != iVar21) {
                    fVar33 = (float)iVar21;
                    fVar31 = (float)(iVar21 + 1);
                    fVar36 = (fVar33 - fVar28) / local_25c + fVar29;
                    fVar32 = (fVar31 - fVar28) / local_25c + fVar29;
                    if ((fVar33 <= fVar28) || (fVar38 <= fVar31)) {
                      if ((fVar33 <= fVar38) || (fVar28 <= fVar31)) {
                        if (((fVar33 <= fVar28) || (fVar38 <= fVar33)) &&
                           ((fVar33 <= fVar38 || (fVar28 <= fVar33)))) {
                          if (((fVar28 < fVar31) && (fVar31 < fVar38)) ||
                             ((fVar36 = fVar29, fVar33 = fVar28, fVar38 < fVar31 &&
                              (fVar31 < fVar28)))) goto LAB_0013af6f;
                          goto LAB_0013b033;
                        }
                      }
                      else {
                        stbtt__handle_clipped_edge
                                  (scanline_00,iVar21,psVar11,fVar28,fVar29,fVar31,fVar32);
                        fVar29 = fVar32;
                        fVar28 = fVar31;
                      }
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar21,psVar11,fVar28,fVar29,fVar33,fVar36);
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar21,psVar11,fVar28,fVar29,fVar33,fVar36);
                      fVar29 = fVar36;
                      fVar28 = fVar33;
LAB_0013af6f:
                      stbtt__handle_clipped_edge
                                (scanline_00,iVar21,psVar11,fVar28,fVar29,fVar31,fVar32);
                      fVar36 = fVar32;
                      fVar33 = fVar31;
                    }
LAB_0013b033:
                    stbtt__handle_clipped_edge
                              (scanline_00,iVar21,psVar11,fVar33,fVar36,fVar38,fVar27);
                    fVar28 = (float)local_258._0_4_;
                    fVar29 = y0;
                    iVar21 = iVar21 + 1;
                  }
                }
                else {
                  if (fVar31 <= fVar29) {
                    fVar31 = fVar29;
                  }
                  uVar13 = (uint)fVar32;
                  if (fVar27 <= fVar36) {
                    fVar36 = fVar27;
                  }
                  uVar7 = (uint)fVar37;
                  if (uVar13 == uVar7) {
                    if (((int)uVar13 < 0) || ((int)(float)local_2a0 <= (int)uVar13)) {
                      __assert_fail("x >= 0 && x < len",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xbc1,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar28 = psVar11->direction;
                    uVar15 = (ulong)uVar13;
                    scanline_00[uVar15] =
                         (((fVar37 - (float)(int)uVar13) + (fVar32 - (float)(int)uVar13)) * -0.5 +
                         1.0) * fVar28 * (fVar36 - fVar31) + scanline_00[uVar15];
                    fVar28 = (fVar36 - fVar31) * fVar28;
                  }
                  else {
                    fVar33 = psVar11->fdy;
                    fVar35 = fVar37;
                    uVar8 = uVar13;
                    if (fVar37 < fVar32) {
                      fVar34 = fVar29 - fVar31;
                      fVar31 = (fVar29 - fVar36) + fVar27;
                      fVar33 = -fVar33;
                      fVar35 = fVar32;
                      fVar28 = fVar38;
                      uVar8 = uVar7;
                      uVar7 = uVar13;
                      fVar32 = fVar37;
                      fVar36 = fVar34 + fVar27;
                    }
                    iVar21 = uVar8 + 1;
                    fVar37 = ((float)iVar21 - fVar28) * fVar33 + fVar29;
                    fVar28 = psVar11->direction;
                    fVar38 = (fVar37 - fVar31) * fVar28;
                    scanline_00[(int)uVar8] =
                         (1.0 - ((fVar32 - (float)(int)uVar8) + 1.0) * 0.5) * fVar38 +
                         scanline_00[(int)uVar8];
                    uVar15 = (ulong)(int)uVar7;
                    for (lVar25 = (long)iVar21; lVar25 < (long)uVar15; lVar25 = lVar25 + 1) {
                      scanline_00[lVar25] = fVar33 * fVar28 * 0.5 + fVar38 + scanline_00[lVar25];
                      fVar38 = fVar38 + fVar33 * fVar28;
                    }
                    if (1.01 < ABS(fVar38)) {
                      __assert_fail("fabs(area) <= 1.01f",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xbe6,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    scanline_00[uVar15] =
                         (fVar36 - (fVar33 * (float)(int)(uVar7 - iVar21) + fVar37)) *
                         (((fVar35 - (float)(int)uVar7) + 0.0) * -0.5 + 1.0) * fVar28 + fVar38 +
                         scanline_00[uVar15];
                    fVar28 = (fVar36 - fVar31) * fVar28;
                  }
                  scanline[uVar15 + 1] = fVar28 + scanline[uVar15 + 1];
                }
              }
              else if (fVar28 < fVar26) {
                if (0.0 <= fVar28) {
                  local_258 = ZEXT416((uint)fVar28);
                  stbtt__handle_clipped_edge
                            (scanline_00,(int)fVar28,psVar11,fVar28,fVar29,fVar28,fVar27);
                  iVar21 = (int)fVar28 + 1;
                  fVar29 = y0;
                  fVar28 = (float)local_258._0_4_;
                }
                else {
                  iVar21 = 0;
                }
                stbtt__handle_clipped_edge(scanline,iVar21,psVar11,fVar28,fVar29,fVar28,fVar27);
                fVar29 = y0;
              }
            }
          }
          fVar29 = 0.0;
          for (lVar25 = 0; lVar25 < local_278->w; lVar25 = lVar25 + 1) {
            fVar29 = fVar29 + scanline[lVar25];
            iVar20 = (int)(ABS(scanline_00[lVar25] + fVar29) * 255.0 + 0.5);
            uVar12 = (uchar)iVar20;
            if (0xfe < iVar20) {
              uVar12 = 0xff;
            }
            local_278->pixels[lVar25 + (long)iVar21 * (long)local_278->stride] = uVar12;
          }
          local_2a0 = (long)local_278->w;
          psVar11 = (stbtt__active_edge *)&active;
          while (psVar11 = psVar11->next, psVar11 != (stbtt__active_edge *)0x0) {
            psVar11->fx = psVar11->fdx + psVar11->fx;
          }
          uVar15 = (ulong)((int)local_270 + 1);
          iVar20 = local_278->h;
          __ptr_00 = local_240;
        }
        while (__ptr_00 != (undefined8 *)0x0) {
          puVar10 = (undefined8 *)*__ptr_00;
          free(__ptr_00);
          __ptr_00 = puVar10;
        }
        if (scanline_00 != (float *)&local_238) {
          free(scanline_00);
        }
        free(p);
      }
      free(__ptr);
      __ptr = local_280;
LAB_0013b3a1:
      free(__ptr);
      return;
    }
    local_238 = local_238 & 0xffffffff00000000;
    fVar29 = 0.0;
    fVar36 = 0.0;
    uVar13 = 0xffffffff;
    for (lVar25 = 0; fVar28 = (float)local_238, uVar15 * 0xe - lVar25 != 0; lVar25 = lVar25 + 0xe) {
      switch((&vertices->type)[lVar25]) {
      case '\x01':
        if (-1 < (int)uVar13) {
          (&__ptr->x)[uVar13] = (float)((int)(float)local_238 - (int)fVar27);
        }
        uVar13 = uVar13 + 1;
        auVar30 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar30 = pshuflw(auVar30,auVar30,0x60);
        fVar29 = (float)(auVar30._0_4_ >> 0x10);
        fVar36 = (float)(auVar30._4_4_ >> 0x10);
        local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
        fVar27 = fVar28;
        if (points != (stbtt__point *)0x0) {
          points[(int)fVar28].x = fVar29;
          points[(int)fVar28].y = fVar36;
        }
        break;
      case '\x02':
        lVar18 = (long)(int)(float)local_238;
        auVar30 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar30 = pshuflw(auVar30,auVar30,0x60);
        fVar29 = (float)(auVar30._0_4_ >> 0x10);
        fVar36 = (float)(auVar30._4_4_ >> 0x10);
        local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
        if (points != (stbtt__point *)0x0) {
          points[lVar18].x = fVar29;
          points[lVar18].y = fVar36;
        }
        break;
      case '\x03':
        stbtt__tesselate_curve
                  (points,(int *)&local_238,fVar29,fVar36,
                   (float)(int)*(short *)((long)&vertices->cx + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy + lVar25),
                   (float)(int)*(short *)((long)&vertices->x + lVar25),
                   (float)(int)*(short *)((long)&vertices->y + lVar25),fVar26,0);
        goto LAB_0013a7bc;
      case '\x04':
        stbtt__tesselate_cubic
                  (points,(int *)&local_238,fVar29,fVar36,
                   (float)(int)*(short *)((long)&vertices->cx + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy + lVar25),
                   (float)(int)*(short *)((long)&vertices->cx1 + lVar25),
                   (float)(int)*(short *)((long)&vertices->cy1 + lVar25),
                   (float)(int)*(short *)((long)&vertices->x + lVar25),
                   (float)(int)*(short *)((long)&vertices->y + lVar25),fVar26,0);
LAB_0013a7bc:
        auVar30 = ZEXT416(*(uint *)((long)&vertices->x + lVar25));
        auVar30 = pshuflw(auVar30,auVar30,0x60);
        fVar29 = (float)(auVar30._0_4_ >> 0x10);
        fVar36 = (float)(auVar30._4_4_ >> 0x10);
      }
    }
    (&__ptr->x)[(int)uVar13] = (float)((int)(float)local_238 - (int)fVar27);
    iVar20 = iVar20 + 1;
    fVar29 = (float)local_238;
  } while( true );
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}